

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O2

ze_result_t
loader::zesVFManagementGetVFCapabilitiesExp2
          (zes_vf_handle_t hVFhandle,zes_vf_exp2_capabilities_t *pCapability)

{
  ze_result_t zVar1;
  
  if (*(code **)(*(long *)(hVFhandle + 8) + 0xd20) != (code *)0x0) {
    zVar1 = (**(code **)(*(long *)(hVFhandle + 8) + 0xd20))(*(undefined8 *)hVFhandle);
    return zVar1;
  }
  return ZE_RESULT_ERROR_UNINITIALIZED;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesVFManagementGetVFCapabilitiesExp2(
        zes_vf_handle_t hVFhandle,                      ///< [in] Sysman handle for the VF component.
        zes_vf_exp2_capabilities_t* pCapability         ///< [in,out] Will contain VF capability.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_vf_object_t*>( hVFhandle )->dditable;
        auto pfnGetVFCapabilitiesExp2 = dditable->zes.VFManagementExp.pfnGetVFCapabilitiesExp2;
        if( nullptr == pfnGetVFCapabilitiesExp2 )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hVFhandle = reinterpret_cast<zes_vf_object_t*>( hVFhandle )->handle;

        // forward to device-driver
        result = pfnGetVFCapabilitiesExp2( hVFhandle, pCapability );

        return result;
    }